

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O3

void __thiscall bwtil::FileReader::FileReader(FileReader *this,string *path)

{
  ifstream *this_00;
  long lVar1;
  long lVar2;
  
  this->n = 0;
  this->pos = 0;
  this_00 = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(this_00,(path->_M_dataplus)._M_p,_S_bin);
  this->fs = (ifstream *)this_00;
  lVar1 = std::istream::tellg();
  std::istream::seekg((long)this->fs,_S_beg);
  lVar2 = std::istream::tellg();
  std::istream::seekg((long)this->fs,_S_beg);
  this->n = lVar2 - lVar1;
  this->pos = 0;
  return;
}

Assistant:

FileReader(string path){

		fs = new ifstream(path.c_str(), ios::binary);

		streampos begin,end;
		begin = fs->tellg();
		fs->seekg (0, ios::end);
		end = fs->tellg();
		fs->seekg (0, ios::beg);

		n=end-begin;
		pos=0;

	}